

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchedMatmulLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  pointer pcVar3;
  Rep *pRVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  undefined1 *puVar8;
  size_type *psVar9;
  int iVar10;
  undefined1 *puVar11;
  Result *_result;
  string err;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  iVar10 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar10 == 2) {
    if ((iVar6 == 2) && ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
      pRVar4 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
      iVar10 = *(int *)((long)pRVar4->elements[0] + 0x24);
      iVar6 = *(int *)((long)pRVar4->elements[1] + 0x24);
      if (iVar6 < iVar10) {
        iVar6 = iVar10;
      }
      iVar10 = 2;
      if (2 < iVar6) {
        iVar10 = iVar6;
      }
      if (*(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) == iVar10) goto LAB_00349a10;
      std::operator+(&local_48,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_68.field_2._M_allocated_capacity = *psVar9;
        local_68.field_2._8_8_ = plVar7[3];
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar9;
        local_68._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_68._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
    }
    else {
LAB_00349a10:
      uVar2 = layer->_oneof_case_[0];
      puVar8 = *(undefined1 **)&layer->layer_;
      puVar11 = puVar8;
      if (uVar2 != 0x415) {
        puVar11 = Specification::_BatchedMatMulLayerParams_default_instance_;
      }
      if (((BatchedMatMulLayerParams *)puVar11)->hasbias_ == true) {
        std::operator+(&local_48,"BatchedMatMul layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68.field_2._8_8_ = plVar7[3];
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_68._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
      }
      else {
        if (((BatchedMatMulLayerParams *)puVar11)->int8dynamicquantize_ != true) goto LAB_00349afa;
        std::operator+(&local_48,"BatchedMatMul layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68.field_2._8_8_ = plVar7[3];
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_68._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
      }
    }
LAB_00349d49:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (((iVar10 == 1) && (iVar6 == 1)) &&
       ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
      if (*(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) !=
          *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24
                  )) {
        std::operator+(&local_48,"BatchedMatMul layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68.field_2._8_8_ = plVar7[3];
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_68._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
        goto LAB_00349d49;
      }
    }
    else if (1 < iVar10) goto LAB_00349a10;
    uVar2 = layer->_oneof_case_[0];
    puVar8 = *(undefined1 **)&layer->layer_;
LAB_00349afa:
    if (uVar2 != 0x415) {
      puVar8 = Specification::_BatchedMatMulLayerParams_default_instance_;
    }
    if (((BatchedMatMulLayerParams *)puVar8)->int8dynamicquantize_ == true) {
      puVar8 = (undefined1 *)(((ActivationParams *)puVar8)->NonlinearityType_).linear_;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BatchedMatMul","");
      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
        puVar8 = Specification::_WeightParams_default_instance_;
      }
      validateInt8Requirements
                (__return_storage_ptr__,(WeightParams *)puVar8,&local_68,
                 (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      bVar5 = Result::good(__return_storage_ptr__);
      if (!bVar5) {
        return __return_storage_ptr__;
      }
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
    }
    if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
      if (layer->_oneof_case_[0] == 0x415) {
        puVar8 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar8 = Specification::_BatchedMatMulLayerParams_default_instance_;
      }
      puVar11 = (undefined1 *)(((ActivationParams *)puVar8)->NonlinearityType_).linear_;
      if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
        puVar11 = Specification::_WeightParams_default_instance_;
      }
      puVar8 = (undefined1 *)((InnerProductLayerParams *)puVar8)->bias_;
      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
        puVar8 = Specification::_WeightParams_default_instance_;
      }
      validateInnerProductWeightsBias
                (__return_storage_ptr__,layer,(WeightParams *)puVar11,(WeightParams *)puVar8);
      bVar5 = Result::good(__return_storage_ptr__);
      if (!bVar5) {
        return __return_storage_ptr__;
      }
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchedMatmulLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // validate rank, if present
    if (layer.input_size() == 2 && layer.inputtensor_size() == 2 && layer.outputtensor_size() == 1) {
        int in1_rank = static_cast<int>(layer.inputtensor(0).rank());
        int in2_rank = static_cast<int>(layer.inputtensor(1).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != std::max(2, std::max(in1_rank, in2_rank))) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': given ranks of the two inputs, rank of the output is incorrect.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() == 1 && layer.inputtensor_size() == 1 && layer.outputtensor_size() == 1) {
        int in_rank = static_cast<int>(layer.inputtensor(0).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != in_rank) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': has one input, in this case, output and input ranks must be equal but they are not.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().hasbias()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': has two inputs and 'hasBias' flag is set to True."
                                "However, bias is only supported when the layer has 1 input.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().int8dynamicquantize()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': cannot use dynamic quantization with 2 inputs.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.batchedmatmul().int8dynamicquantize()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInt8Requirements(layer.batchedmatmul().weights(), "BatchedMatMul", layer.name()));
    }

    if (layer.input_size() == 1) {
        const auto& params = layer.batchedmatmul();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInnerProductWeightsBias(layer, params.weights(), params.bias()));
    }

    return Result();
}